

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall Js::CompoundString::AppendSlow(CompoundString *this,char16 c)

{
  code *pcVar1;
  bool bVar2;
  JavascriptString *s;
  undefined4 *puVar3;
  
  Grow(this);
  if (this->directCharLength == 0xffffffff) {
    bVar2 = TryAppendGeneric<Js::CompoundString>(c,this);
  }
  else {
    s = CharStringCache::GetStringForChar
                  (&((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.
                       type.ptr)->javascriptLibrary).ptr)->charStringCache,c);
    bVar2 = TryAppendGeneric<Js::CompoundString>(s,1,this);
  }
  if (bVar2 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x326,"(appended)","appended");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void CompoundString::AppendSlow(const char16 c)
    {
        Grow();
        const bool appended =
            HasOnlyDirectChars()
                ? TryAppendGeneric(c, this)
                : TryAppendGeneric(GetLibrary()->GetCharStringCache().GetStringForChar(c), 1, this);
        Assert(appended);
    }